

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printImmPlusOneOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  int iVar3;
  MCOperand *op;
  int64_t iVar4;
  uint in_ESI;
  MCInst *in_RDI;
  uint Imm;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar4 = MCOperand_getImm(op);
  iVar3 = (int)iVar4;
  printUInt32Bang((SStream *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    puVar1 = in_RDI->flat_insn->detail->groups +
             (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    *(int *)(in_RDI->flat_insn->detail->groups +
            (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = iVar3 + 1;
    pcVar2 = in_RDI->flat_insn->detail;
    (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
  }
  return;
}

Assistant:

static void printImmPlusOneOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned Imm = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	printUInt32Bang(O, Imm + 1);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = Imm + 1;
		MI->flat_insn->detail->arm.op_count++;
	}
}